

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

result_type
time_plain<std::subtract_with_carry_engine<unsigned_long,24ul,10ul,24ul>>
          (subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL> *r)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  result_type rVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  string res;
  string local_48;
  double local_28;
  
  lVar9 = 0x1000000;
  rVar6 = 0;
  lVar2 = std::chrono::_V2::system_clock::now();
  do {
    sVar1 = r->_M_p;
    lVar7 = sVar1 + 0xe;
    if (-1 < (long)(sVar1 - 10)) {
      lVar7 = sVar1 - 10;
    }
    uVar3 = r->_M_carry + r->_M_x[sVar1];
    uVar5 = r->_M_x[lVar7];
    uVar8 = uVar5 + 0x1000000;
    if (uVar5 >= uVar3) {
      uVar8 = uVar5;
    }
    r->_M_carry = (ulong)(uVar5 < uVar3);
    r->_M_x[sVar1] = uVar8 - uVar3;
    uVar4 = r->_M_p + 1;
    uVar5 = 0;
    if (uVar4 < 0x18) {
      uVar5 = uVar4;
    }
    r->_M_p = uVar5;
    rVar6 = rVar6 + (uVar8 - uVar3);
    lVar9 = lVar9 + -1;
  } while (lVar9 != 0);
  lVar9 = std::chrono::_V2::system_clock::now();
  local_28 = 16.777216 / ((double)((lVar9 - lVar2) / 1000) * 1e-06);
  to_string<double>(&local_48,&local_28);
  while (local_48._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_48);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return rVar6;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}